

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O1

void __thiscall
booster::locale::gnu_gettext::message_key<char>::message_key(message_key<char> *this,string_type *c)

{
  long lVar1;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (this->context_)._M_dataplus._M_p = (pointer)&(this->context_).field_2;
  (this->context_)._M_string_length = 0;
  (this->context_).field_2._M_local_buf[0] = '\0';
  (this->key_)._M_dataplus._M_p = (pointer)&(this->key_).field_2;
  (this->key_)._M_string_length = 0;
  (this->key_).field_2._M_local_buf[0] = '\0';
  this->c_context_ = (char_type *)0x0;
  this->c_key_ = (char_type *)0x0;
  lVar1 = std::__cxx11::string::find((char)c,4);
  if (lVar1 == -1) {
    std::__cxx11::string::_M_assign((string *)&this->key_);
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)c);
    std::__cxx11::string::operator=((string *)this,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)c);
    std::__cxx11::string::operator=((string *)&this->key_,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return;
}

Assistant:

message_key(string_type const &c = string_type()) :
                    c_context_(0),
                    c_key_(0)
                {
                    size_t pos = c.find(char_type(4));
                    if(pos == string_type::npos) {
                        key_ = c;
                    }
                    else {
                        context_ = c.substr(0,pos);
                        key_ = c.substr(pos+1);
                    }
                }